

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int calculate_directory_descriptors(iso9660_conflict *iso9660,vdd *vdd,isoent *isoent,int depth)

{
  isoent **ppiVar1;
  isoent *isoent_00;
  int iVar2;
  int iVar3;
  isofile *piStack_58;
  int dr_l;
  isofile *file;
  isoent *np;
  int local_40;
  int i;
  int block;
  int bs;
  isoent **enttbl;
  int depth_local;
  isoent *isoent_local;
  vdd *vdd_local;
  iso9660_conflict *iso9660_local;
  
  local_40 = 1;
  iVar2 = get_dir_rec_size(iso9660,isoent,DIR_REC_SELF,vdd->vdd_type);
  iVar3 = get_dir_rec_size(iso9660,isoent,DIR_REC_PARENT,vdd->vdd_type);
  i = iVar3 + iVar2;
  if (((isoent->children).cnt < 1) ||
     (((vdd->vdd_type != VDD_JOLIET && (((uint)iso9660->opt >> 0x17 & 3) == 0)) &&
      (vdd->max_depth <= depth + 1)))) {
    iso9660_local._4_4_ = 1;
  }
  else {
    ppiVar1 = isoent->children_sorted;
    for (np._4_4_ = 0; np._4_4_ < (isoent->children).cnt; np._4_4_ = np._4_4_ + 1) {
      isoent_00 = ppiVar1[np._4_4_];
      piStack_58 = isoent_00->file;
      if (piStack_58->hardlink_target != (isofile *)0x0) {
        piStack_58 = piStack_58->hardlink_target;
      }
      piStack_58->cur_content = &piStack_58->content;
      do {
        iVar2 = get_dir_rec_size(iso9660,isoent_00,DIR_REC_NORMAL,vdd->vdd_type);
        if (i + iVar2 < 0x801) {
          i = iVar2 + i;
        }
        else {
          local_40 = local_40 + 1;
          i = iVar2;
        }
        piStack_58->cur_content = piStack_58->cur_content->next;
      } while (piStack_58->cur_content != (content_conflict *)0x0);
    }
    iso9660_local._4_4_ = local_40;
  }
  return iso9660_local._4_4_;
}

Assistant:

static int
calculate_directory_descriptors(struct iso9660 *iso9660, struct vdd *vdd,
    struct isoent *isoent, int depth)
{
	struct isoent **enttbl;
	int bs, block, i;

	block = 1;
	bs = get_dir_rec_size(iso9660, isoent, DIR_REC_SELF, vdd->vdd_type);
	bs += get_dir_rec_size(iso9660, isoent, DIR_REC_PARENT, vdd->vdd_type);

	if (isoent->children.cnt <= 0 || (vdd->vdd_type != VDD_JOLIET &&
	    !iso9660->opt.rr && depth + 1 >= vdd->max_depth))
		return (block);

	enttbl = isoent->children_sorted;
	for (i = 0; i < isoent->children.cnt; i++) {
		struct isoent *np = enttbl[i];
		struct isofile *file;

		file = np->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		file->cur_content = &(file->content);
		do {
			int dr_l;

			dr_l = get_dir_rec_size(iso9660, np, DIR_REC_NORMAL,
			    vdd->vdd_type);
			if ((bs + dr_l) > LOGICAL_BLOCK_SIZE) {
				block ++;
				bs = dr_l;
			} else
				bs += dr_l;
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}
	return (block);
}